

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O3

void __thiscall
AbstractTransaction_AddTxOut_RemoveTxOut_Test::TestBody
          (AbstractTransaction_AddTxOut_RemoveTxOut_Test *this)

{
  bool bVar1;
  undefined4 uVar2;
  undefined1 extraout_DL;
  char *pcVar3;
  AssertionResult gtest_ar_1;
  uint32_t txout_count;
  AssertionResult gtest_ar;
  uint64_t satoshi;
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> list;
  Transaction tx;
  AssertHelper local_e0;
  undefined1 local_d8;
  undefined1 local_d0 [16];
  AssertHelper local_c0;
  _Alloc_hider local_b8;
  uint local_ac;
  undefined1 local_a8 [56];
  unsigned_long local_70;
  undefined1 local_68 [88];
  
  local_ac = 1;
  local_70 = 0x12345678;
  cfd::core::Transaction::Transaction((Transaction *)(local_68 + 0x18),2,3);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_68._0_8_ = cfd::core::Amount::CreateBySatoshiAmount(local_70);
      local_e0.data_ = (AssertHelperData *)local_d0;
      local_68[8] = extraout_DL;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e0,"0014913e0b9281dab16f502101ad4e655074396f34c5","");
      cfd::core::Script::Script((Script *)local_a8,(string *)&local_e0);
      cfd::core::Transaction::AddTxOut((Amount *)(local_68 + 0x18),(Script *)local_68);
      cfd::core::Script::~Script((Script *)local_a8);
      if (local_e0.data_ != (AssertHelperData *)local_d0) {
        operator_delete(local_e0.data_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xeb,
               "Expected: tx.AddTxOut(Amount::CreateBySatoshiAmount(satoshi), Script(\"0014913e0b9281dab16f502101ad4e655074396f34c5\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (CONCAT71(local_a8._1_7_,local_a8[0]) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_a8._1_7_,local_a8[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_a8._1_7_,local_a8[0]) + 8))();
      }
    }
  }
  cfd::core::Transaction::GetTxOutList();
  local_e0.data_ = *(AssertHelperData **)(local_68._0_8_ + 8);
  local_d8 = *(undefined1 *)(local_68._0_8_ + 0x10);
  testing::internal::CmpHelperEQ<cfd::core::Amount,unsigned_long>
            ((internal *)local_a8,"list[0].GetValue()","satoshi",(Amount *)&local_e0,&local_70);
  if ((internal)local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if ((pointer)local_a8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_a8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xee,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_e0.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_e0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_e0.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_a8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::Script((Script *)local_a8,(Script *)(local_68._0_8_ + 0x18));
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_c0,"list[0].GetLockingScript().GetHex().c_str()",
             "\"0014913e0b9281dab16f502101ad4e655074396f34c5\"",(char *)local_e0.data_,
             "0014913e0b9281dab16f502101ad4e655074396f34c5");
  if (local_e0.data_ != (AssertHelperData *)local_d0) {
    operator_delete(local_e0.data_);
  }
  cfd::core::Script::~Script((Script *)local_a8);
  if (local_c0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (local_b8._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xf0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (CONCAT71(local_a8._1_7_,local_a8[0]) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_a8._1_7_,local_a8[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_a8._1_7_,local_a8[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar2 = cfd::core::Transaction::GetTxOutCount();
  local_e0.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"tx.GetTxOutCount()","txout_count",(uint *)&local_e0,&local_ac);
  if ((internal)local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if ((pointer)local_a8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_a8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xf1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_e0.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_e0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_e0.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_a8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::core::Transaction::RemoveTxOut((int)local_68 + 0x18);
  }
  testing::Message::Message((Message *)local_a8);
  testing::internal::AssertHelper::AssertHelper
            (&local_e0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
             ,0xf4,
             "Expected: tx.RemoveTxOut(3) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_a8);
  testing::internal::AssertHelper::~AssertHelper(&local_e0);
  if (CONCAT71(local_a8._1_7_,local_a8[0]) != 0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && ((long *)CONCAT71(local_a8._1_7_,local_a8[0]) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_a8._1_7_,local_a8[0]) + 8))();
    }
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::RemoveTxOut((int)local_68 + 0x18);
    }
  }
  else {
    testing::Message::Message((Message *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xf6,
               "Expected: tx.RemoveTxOut(0) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (CONCAT71(local_a8._1_7_,local_a8[0]) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_a8._1_7_,local_a8[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_a8._1_7_,local_a8[0]) + 8))();
      }
    }
  }
  local_ac = local_ac - 1;
  uVar2 = cfd::core::Transaction::GetTxOutCount();
  local_e0.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"tx.GetTxOutCount()","txout_count",(uint *)&local_e0,&local_ac);
  if ((internal)local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if ((pointer)local_a8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_a8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xf8,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_e0.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_e0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_e0.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_a8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::~vector
            ((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *)
             local_68);
  cfd::core::Transaction::~Transaction((Transaction *)(local_68 + 0x18));
  return;
}

Assistant:

TEST(AbstractTransaction, AddTxOut_RemoveTxOut) {
  uint32_t txout_count = 1;
  int32_t version = 2;
  uint32_t locktime = 3;
  uint64_t satoshi = 0x12345678;

  Transaction tx(version, locktime);
  // script is not empty
  EXPECT_NO_THROW(
      tx.AddTxOut(Amount::CreateBySatoshiAmount(satoshi),
                  Script("0014913e0b9281dab16f502101ad4e655074396f34c5")));

  std::vector<TxOutReference> list = tx.GetTxOutList();
  EXPECT_EQ(list[0].GetValue(), satoshi);
  EXPECT_STREQ(list[0].GetLockingScript().GetHex().c_str(),
      "0014913e0b9281dab16f502101ad4e655074396f34c5");
  EXPECT_EQ(tx.GetTxOutCount(), txout_count);

  // index error
  EXPECT_THROW(tx.RemoveTxOut(3), CfdException);
  // remove success
  EXPECT_NO_THROW(tx.RemoveTxOut(0));
  txout_count--;
  EXPECT_EQ(tx.GetTxOutCount(), txout_count);
}